

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QFlags<QGraphicsView::OptimizationFlag>,_true>::
     debugStream(QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RDX;
  QDebug *in_RSI;
  undefined8 in_RDI;
  QFlagsStorage<QGraphicsView::OptimizationFlag> flags;
  long in_FS_OFFSET;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  flags.i = (Int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  operator<<<QFlags<QGraphicsView::OptimizationFlag>,_true>
            (in_RDX,(QFlags<QGraphicsView::OptimizationFlag>)flags.i);
  QDebug::~QDebug(&local_10);
  QDebug::~QDebug(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }